

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O2

_Bool save_game_checked(void)

{
  _Bool _Var1;
  _Bool _Var2;
  char *str;
  char path [1024];
  
  disturb(player);
  event_signal(EVENT_MESSAGE_FLUSH);
  handle_stuff(player);
  prt("Saving game...",L'\0',L'\0');
  Term_fresh();
  my_strcpy(player->died_from,"(saved)",0x50);
  signals_ignore_tstp();
  _Var1 = savefile_save(savefile);
  str = "Saving game... failed!";
  if (_Var1) {
    str = "Saving game... done.";
  }
  prt(str,L'\0',L'\0');
  Term_fresh();
  signals_handle_tstp();
  path_build(path,0x400,ANGBAND_DIR_USER,"window.prf");
  _Var2 = prefs_save(path,option_dump,"Dump window settings");
  if (!_Var2) {
    prt("Failed to save subwindow preferences",L'\0',L'\0');
  }
  Term_fresh();
  _Var2 = lore_save("lore.txt");
  if (!_Var2) {
    msg("lore save failed!");
    event_signal(EVENT_MESSAGE_FLUSH);
  }
  Term_fresh();
  my_strcpy(player->died_from,"(alive and well)",0x50);
  return _Var1;
}

Assistant:

bool save_game_checked(void)
{
	char path[1024];
	bool result;

	/* Disturb the player */
	disturb(player);

	/* Clear messages */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Handle stuff */
	handle_stuff(player);

	/* Message */
	prt("Saving game...", 0, 0);

	/* Refresh */
	Term_fresh();

	/* The player is not dead */
	my_strcpy(player->died_from, "(saved)", sizeof(player->died_from));

	/* Forbid suspend */
	signals_ignore_tstp();

	/* Save the player */
	if (savefile_save(savefile)) {
		prt("Saving game... done.", 0, 0);
		result = true;
	} else {
		prt("Saving game... failed!", 0, 0);
		result = false;
	}

	/* Refresh */
	Term_fresh();

	/* Allow suspend again */
	signals_handle_tstp();

	/* Save the window prefs */
	path_build(path, sizeof(path), ANGBAND_DIR_USER, "window.prf");
	if (!prefs_save(path, option_dump, "Dump window settings"))
		prt("Failed to save subwindow preferences", 0, 0);

	/* Refresh */
	Term_fresh();

	/* Save monster memory to user directory */
	if (!lore_save("lore.txt")) {
		msg("lore save failed!");
		event_signal(EVENT_MESSAGE_FLUSH);
	}

	/* Refresh */
	Term_fresh();

	/* Note that the player is not dead */
	my_strcpy(player->died_from, "(alive and well)", sizeof(player->died_from));

	return result;
}